

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_char,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  float *pfVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  long lVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  float *pfVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  bVar2 = (k->res).ulog2;
  iVar19 = 4 << (bVar2 & 0x1f);
  lVar15 = (long)iVar19 * (long)k->vw;
  if ((int)lVar15 != 0) {
    puVar17 = (undefined4 *)((long)data + ((long)(k->v << (bVar2 & 0x1f)) + (long)k->u) * 4);
    puVar16 = (undefined4 *)(lVar15 + (long)puVar17);
    pfVar18 = k->kv;
    iVar3 = k->uw;
    pfVar5 = k->ku;
    do {
      uVar4 = *puVar17;
      uVar12 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar12;
      auVar6[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar7[8] = (char)((uint)uVar4 >> 0x10);
      auVar7._0_8_ = uVar12;
      auVar7[9] = 0;
      auVar7._10_3_ = auVar6._10_3_;
      auVar13._5_8_ = 0;
      auVar13._0_5_ = auVar7._8_5_;
      auVar8[4] = (char)((uint)uVar4 >> 8);
      auVar8._0_4_ = (int)uVar12;
      auVar8[5] = 0;
      auVar8._6_7_ = SUB137(auVar13 << 0x40,6);
      fVar23 = *pfVar5;
      fVar20 = fVar23 * (float)(int)uVar12;
      fVar21 = fVar23 * (float)auVar8._4_4_;
      fVar22 = fVar23 * (float)auVar7._8_4_;
      fVar23 = fVar23 * (float)(uint3)(auVar6._10_3_ >> 0x10);
      if (iVar3 != 1) {
        lVar15 = 0;
        do {
          uVar4 = *(undefined4 *)((long)puVar17 + lVar15 + 4);
          uVar12 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar12;
          auVar9[0xc] = (char)((uint)uVar4 >> 0x18);
          auVar10[8] = (char)((uint)uVar4 >> 0x10);
          auVar10._0_8_ = uVar12;
          auVar10[9] = 0;
          auVar10._10_3_ = auVar9._10_3_;
          auVar14._5_8_ = 0;
          auVar14._0_5_ = auVar10._8_5_;
          auVar11[4] = (char)((uint)uVar4 >> 8);
          auVar11._0_4_ = (int)uVar12;
          auVar11[5] = 0;
          auVar11._6_7_ = SUB137(auVar14 << 0x40,6);
          fVar1 = *(float *)((long)pfVar5 + lVar15 + 4);
          fVar20 = fVar20 + fVar1 * (float)(int)uVar12;
          fVar21 = fVar21 + fVar1 * (float)auVar11._4_4_;
          fVar22 = fVar22 + fVar1 * (float)auVar10._8_4_;
          fVar23 = fVar23 + fVar1 * (float)(uint3)(auVar9._10_3_ >> 0x10);
          lVar15 = lVar15 + 4;
        } while ((long)(iVar3 * 4) + -4 != lVar15);
        puVar17 = (undefined4 *)((long)puVar17 + lVar15);
      }
      fVar1 = *pfVar18;
      pfVar18 = pfVar18 + 1;
      *result = fVar1 * fVar20 + *result;
      result[1] = fVar1 * fVar21 + result[1];
      result[2] = fVar1 * fVar22 + result[2];
      result[3] = fVar1 * fVar23 + result[3];
      puVar17 = (undefined4 *)((long)puVar17 + (long)(iVar19 + iVar3 * -4) + 4);
    } while (puVar17 != puVar16);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }